

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_line.c
# Opt level: O3

int dwarf_linesrc(Dwarf_Line line,char **ret_linesrc,Dwarf_Error *error)

{
  int iVar1;
  Dwarf_Signed errval;
  
  if (line == (Dwarf_Line)0x0) {
    errval = 0x3b;
  }
  else {
    if (line->li_context != (Dwarf_Line_Context)0x0) {
      iVar1 = _dwarf_filename(line->li_context,(line->li_l_data).li_file,ret_linesrc,"dwarf_linesrc"
                              ,error);
      return iVar1;
    }
    errval = 0x66;
  }
  _dwarf_error((Dwarf_Debug)0x0,error,errval);
  return 1;
}

Assistant:

int
dwarf_linesrc(Dwarf_Line line, char **ret_linesrc,
    Dwarf_Error * error)
{
    if (line == NULL) {
        _dwarf_error(NULL, error, DW_DLE_DWARF_LINE_NULL);
        return DW_DLV_ERROR;
    }
    if (line->li_context == NULL) {
        _dwarf_error(NULL, error, DW_DLE_LINE_CONTEXT_NULL);
        return DW_DLV_ERROR;
    }
    return _dwarf_filename(line->li_context,
        line->li_l_data.li_file, ret_linesrc,
        "dwarf_linesrc",error);
}